

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O1

wchar_t o_ranged_damage(player *p,monster_conflict *mon,object *missile,object *launcher,wchar_t b,
                       wchar_t s,uint32_t *msg_type)

{
  _Bool _Var1;
  int16_t iVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  uint32_t uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint num;
  int iVar10;
  
  if (launcher == (object *)0x0) {
    wVar3 = L'\x01';
  }
  else {
    wVar3 = (p->state).ammo_mult;
  }
  iVar10 = (((uint)missile->ds + (uint)missile->ds * 4) * 2 + 10 >> 1) * wVar3;
  num = (uint)missile->dd;
  if (b == L'\0') {
    if (s != L'\0') {
      wVar3 = slays[s].o_multiplier;
      goto LAB_0019fa77;
    }
    iVar10 = iVar10 * 10;
    iVar9 = 0;
  }
  else {
    wVar3 = get_monster_brand_multiplier(mon,brands + b,true);
LAB_0019fa77:
    iVar10 = iVar10 * wVar3;
    iVar9 = wVar3 + L'\xfffffff6';
  }
  wVar3 = object_to_dam(missile);
  if (launcher == (object *)0x0) {
    _Var1 = flag_has_dbg(missile->flags,5,0x25,"missile->flags","OF_THROWING");
    if (_Var1) {
      wVar3 = wVar3 + (p->state).to_d;
    }
  }
  else {
    wVar4 = object_to_dam(launcher);
    wVar3 = wVar4 + wVar3 + (p->state).to_d;
  }
  wVar4 = L'\x96';
  if (wVar3 < L'\x96') {
    wVar4 = wVar3;
  }
  uVar6 = 0xffffff6a;
  if (L'\xffffff6a' < wVar4) {
    uVar6 = (ulong)(uint)wVar4;
  }
  if (wVar3 < L'\0') {
    iVar8 = 0;
    if (99 < deadliness_conversion[(uint)-(int)uVar6]) goto LAB_0019fb21;
    uVar7 = -(uint)deadliness_conversion[(uint)-(int)uVar6];
  }
  else {
    uVar7 = (uint)deadliness_conversion[uVar6];
  }
  iVar8 = (uVar7 + 100) * iVar10;
LAB_0019fb21:
  uVar5 = Rand_div(10000);
  if (launcher == (object *)0x0) {
    _Var1 = flag_has_dbg(missile->flags,5,0x25,"missile->flags","OF_THROWING");
    if (_Var1) {
      wVar3 = o_critical_shot(p,mon,missile,(object *)0x0,msg_type);
      iVar2 = object_weight_one(missile);
      num = (int)(short)(iVar2 / 0xc + 2) * (wVar3 + num);
    }
  }
  else {
    wVar3 = o_critical_shot(p,mon,missile,launcher,msg_type);
    num = num + wVar3;
  }
  iVar10 = iVar8 * 2 + -10000;
  iVar10 = damroll(num,(uint)((int)uVar5 < iVar10 % 10000) + iVar10 / 10000);
  return iVar10 + iVar9;
}

Assistant:

static int o_ranged_damage(struct player *p, const struct monster *mon,
		struct object *missile, struct object *launcher,
		int b, int s, uint32_t *msg_type)
{
	int mult = (launcher ? p->state.ammo_mult : 1);
	int dice = missile->dd;
	int sides, deadliness, dmg, add = 0;
	bool extra;

	/* Get the average value of a single damage die. (x10) */
	int die_average = (10 * (missile->ds + 1)) / 2;

	/* Apply the launcher multiplier. */
	die_average *= mult;

	/* Adjust the average for slays and brands. (10x inflation) */
	if (b) {
		int bmult = get_monster_brand_multiplier(mon, &brands[b], true);

		die_average *= bmult;
		add = bmult - 10;
	} else if (s) {
		die_average *= slays[s].o_multiplier;
		add = slays[s].o_multiplier - 10;
	} else {
		die_average *= 10;
	}

	/* Apply deadliness to average. (100x inflation) */
	deadliness = object_to_dam(missile);
	if (launcher) {
		deadliness += object_to_dam(launcher) + p->state.to_d;
	} else if (of_has(missile->flags, OF_THROWING)) {
		deadliness += p->state.to_d;
	}
	apply_deadliness(&die_average, MIN(deadliness, 150));

	/* Calculate the actual number of sides to each die. */
	sides = (2 * die_average) - 10000;
	extra = randint0(10000) < (sides % 10000);
	sides /= 10000;
	sides += (extra ? 1 : 0);

	/* Get number of critical dice - only for suitable objects */
	if (launcher) {
		dice += o_critical_shot(p, mon, missile, launcher, msg_type);
	} else if (of_has(missile->flags, OF_THROWING)) {
		dice += o_critical_shot(p, mon, missile, NULL, msg_type);

		/* Multiply the number of damage dice by the throwing weapon
		 * multiplier.  This is not the prettiest equation,
		 * but it does at least try to keep throwing weapons competitive. */
		dice *= 2 + object_weight_one(missile) / 12;
	}

	/* Roll out the damage. */
	dmg = damroll(dice, sides);

	/* Apply any special additions to damage. */
	dmg += add;

	return dmg;
}